

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void pnga_set_diagonal(Integer g_a,Integer g_v)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  Integer icode;
  int iVar6;
  Integer IVar7;
  undefined8 *buf;
  char *pcVar8;
  undefined8 *puVar9;
  long lVar10;
  long lVar11;
  Integer iloA;
  long lVar12;
  bool bVar13;
  char *ptr;
  Integer ld;
  Integer loA [2];
  Integer hiA [2];
  Integer atype;
  Integer vtype;
  Integer vdims;
  Integer vndim;
  Integer vhi;
  Integer vlo;
  Integer andim;
  Integer adims [2];
  _iterator_hdl hdl;
  char *local_3f8;
  long local_3f0;
  long local_3e8;
  long local_3e0;
  long local_3d8;
  long local_3d0;
  long local_3c0;
  long local_3b8;
  long local_3b0;
  Integer local_3a8;
  long local_3a0;
  long local_398;
  long local_390;
  Integer local_388;
  Integer local_380;
  long local_378;
  long local_370;
  long local_368;
  long local_360;
  long local_350;
  long local_348;
  long local_340;
  _iterator_hdl local_330;
  
  pnga_nodeid();
  pnga_nnodes();
  iVar2 = _ga_sync_end;
  bVar13 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar13) {
    pnga_sync();
  }
  pnga_check_handle(g_a,"ga_set_diagonal_");
  pnga_check_handle(g_v,"ga_set_diagonal_");
  pnga_inquire(g_a,&local_3a8,&local_350,&local_348);
  icode = local_3a8;
  pnga_inquire(g_v,&local_3a0,&local_390,&local_398);
  if (local_350 != 2) {
    pnga_error("ga_set_diagonal: wrong dimension for g_a.",local_350);
  }
  if (local_390 != 1) {
    pnga_error("ga_set_diagonal: wrong dimension for g_v.",local_390);
  }
  if (local_348 < local_340) {
    local_340 = local_348;
  }
  if (local_398 != local_340) {
    pnga_error("ga_set_diagonal: The size of the first array\'s diagonal is greater than the size of the second array."
               ,icode);
  }
  if (local_3a0 != local_3a8) {
    pnga_error("ga_set_diagonal: input global arrays do not have the same data type. Global array type ="
               ,local_3a8);
  }
  pnga_local_iterator_init(g_a,&local_330);
  iVar6 = pnga_local_iterator_next(&local_330,&local_3e8,&local_3d8,&local_3f8,&local_3f0);
  if (iVar6 != 0) {
    local_3c0 = icode + -0x3e9;
    do {
      lVar5 = local_3e0;
      lVar4 = local_3e8;
      lVar3 = local_3f0;
      pcVar8 = local_3f8;
      if (0 < local_3e8) {
        lVar10 = local_3e0;
        if (local_3e0 < local_3e8) {
          lVar10 = local_3e8;
        }
        lVar12 = local_3d0;
        if (local_3d8 < local_3d0) {
          lVar12 = local_3d8;
        }
        lVar11 = lVar12 - lVar10;
        if (lVar10 <= lVar12) {
          local_3b8 = local_3d0;
          local_3b0 = local_3d8;
          IVar7 = GAsizeof(icode);
          lVar12 = lVar11 + 1;
          buf = (undefined8 *)malloc(IVar7 * lVar12);
          if (buf == (undefined8 *)0x0) {
            pnga_error("ga_set_diagonal_:failed to allocate memory for local buffer",0);
          }
          pnga_get(g_v,&local_380,&local_388,buf,&local_388);
          switch(local_3c0) {
          case 0:
            if (-1 < lVar11) {
              pcVar8 = pcVar8 + (lVar10 - lVar5) * lVar3 * 4 + (lVar10 - lVar4) * 4;
              lVar10 = 0;
              do {
                *(undefined4 *)pcVar8 = *(undefined4 *)((long)buf + lVar10 * 4);
                lVar10 = lVar10 + 1;
                pcVar8 = pcVar8 + lVar3 * 4 + 4;
              } while (lVar11 + 1 != lVar10);
            }
            break;
          case 1:
            if (-1 < lVar11) {
              pcVar8 = pcVar8 + (lVar10 - lVar5) * lVar3 * 8 + (lVar10 - lVar4) * 8;
              lVar10 = 0;
              do {
                *(undefined8 *)pcVar8 = buf[lVar10];
                lVar10 = lVar10 + 1;
                pcVar8 = pcVar8 + lVar3 * 8 + 8;
              } while (lVar11 + 1 != lVar10);
            }
            break;
          case 2:
            if (-1 < lVar11) {
              pcVar8 = pcVar8 + (lVar10 - lVar5) * lVar3 * 4 + (lVar10 - lVar4) * 4;
              lVar10 = 0;
              do {
                *(undefined4 *)pcVar8 = *(undefined4 *)((long)buf + lVar10 * 4);
                lVar10 = lVar10 + 1;
                pcVar8 = pcVar8 + lVar3 * 4 + 4;
              } while (lVar11 + 1 != lVar10);
            }
            break;
          case 3:
            if (-1 < lVar11) {
              pcVar8 = pcVar8 + (lVar10 - lVar5) * lVar3 * 8 + (lVar10 - lVar4) * 8;
              lVar10 = 0;
              do {
                *(undefined8 *)pcVar8 = buf[lVar10];
                lVar10 = lVar10 + 1;
                pcVar8 = pcVar8 + lVar3 * 8 + 8;
              } while (lVar11 + 1 != lVar10);
            }
            break;
          default:
            pnga_error("ga_set_diagonal_: wrong data type:",icode);
            break;
          case 5:
            if (-1 < lVar11) {
              pcVar8 = pcVar8 + (lVar10 - lVar5) * lVar3 * 8 + (lVar10 - lVar4) * 8;
              lVar10 = 0;
              do {
                *(undefined8 *)pcVar8 = buf[lVar10];
                lVar10 = lVar10 + 1;
                pcVar8 = pcVar8 + lVar3 * 8 + 8;
              } while (lVar11 + 1 != lVar10);
            }
            break;
          case 6:
            if (-1 < lVar11) {
              pcVar8 = pcVar8 + (lVar10 - lVar5) * lVar3 * 0x10 + (lVar10 - lVar4) * 0x10;
              puVar9 = buf;
              do {
                uVar1 = puVar9[1];
                *(undefined8 *)pcVar8 = *puVar9;
                *(undefined8 *)(pcVar8 + 8) = uVar1;
                pcVar8 = pcVar8 + lVar3 * 0x10 + 0x10;
                puVar9 = puVar9 + 2;
                lVar12 = lVar12 + -1;
              } while (lVar12 != 0);
            }
          }
          free(buf);
          local_368 = lVar4;
          local_360 = lVar5;
          local_378 = local_3b0;
          local_370 = local_3b8;
          pnga_release_update(g_a,&local_368,&local_378);
        }
      }
      iVar6 = pnga_local_iterator_next(&local_330,&local_3e8,&local_3d8,&local_3f8,&local_3f0);
    } while (iVar6 != 0);
  }
  if (iVar2 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_set_diagonal(Integer g_a, Integer g_v)
{
  Integer vndim, vdims, dim1, dim2, vtype, atype, type;
  Integer me = pnga_nodeid (), i, nproc = pnga_nnodes();
  Integer andim, adims[2];
  Integer loA[2], hiA[2], ld;
  Integer num_blocks_a;
  int local_sync_begin,local_sync_end;
  char *ptr;
  _iterator_hdl hdl;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  pnga_check_handle (g_a, "ga_set_diagonal_");
  pnga_check_handle (g_v, "ga_set_diagonal_");

  pnga_inquire (g_a, &atype, &andim, adims);
  dim1 = adims[0];
  dim2 = adims[1];
  type = atype;
  pnga_inquire (g_v, &vtype, &vndim, &vdims);

  /* Perform some error checking */
  if (andim != 2)
    pnga_error("ga_set_diagonal: wrong dimension for g_a.", andim);
  if (vndim != 1)
    pnga_error("ga_set_diagonal: wrong dimension for g_v.", vndim);


  if (vdims != GA_MIN (dim1, dim2))
    pnga_error
      ("ga_set_diagonal: The size of the first array's diagonal is greater than the size of the second array.",
       type);

  if (vtype != atype)
  {
    pnga_error
      ("ga_set_diagonal: input global arrays do not have the same data type. Global array type =",
       atype);
  }

#if 1
  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl,loA,hiA,&ptr,&ld)) {
    sgai_set_diagonal_block(g_a, ptr, g_v, loA, hiA, ld, type);
  }
#else
  num_blocks_a = pnga_total_blocks(g_a);

  if (num_blocks_a < 0) {
    pnga_distribution(g_a, me, loA, hiA);
    pnga_access_ptr(g_a, loA, hiA, &ptr, &ld);
    sgai_set_diagonal_block(g_a, ptr, g_v, loA, hiA, ld, type);
    pnga_release_update(g_a, loA, hiA);
  } else {
    Integer idx;
    /* Simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)) {
      for (idx = me; idx < num_blocks_a; idx += nproc) {
        pnga_distribution(g_a, idx, loA, hiA);
        pnga_access_block_ptr(g_a, idx, &ptr, &ld);
        sgai_set_diagonal_block(g_a, ptr, g_v, loA, hiA, ld, type);
        pnga_release_update_block(g_a, idx);
      }
    } else {
      /* Uses scalapack block-cyclic data distribution */
      Integer chk;
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);
      while (index[andim-1] < blocks[andim-1]) {
        /* find bounding coordinates of block */
        chk = 1;
        for (i = 0; i < andim; i++) {
          loA[i] = index[i]*block_dims[i]+1;
          hiA[i] = (index[i] + 1)*block_dims[i];
          if (hiA[i] > adims[i]) hiA[i] = adims[i];
          if (hiA[i] < loA[i]) chk = 0;
        }
        if (chk) {
          pnga_access_block_grid_ptr(g_a, index, &ptr, &ld);
          sgai_set_diagonal_block(g_a, ptr, g_v, loA, hiA, ld, type);
          pnga_release_update_block_grid(g_a, index);
        }
        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < andim; i++) {
          if (index[i] >= blocks[i] && i<andim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }

  }
#endif
  if(local_sync_end)pnga_sync();
}